

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_image.cxx
# Opt level: O3

void __thiscall
Fl_PostScript_Graphics_Driver::draw_image_mono
          (Fl_PostScript_Graphics_Driver *this,uchar *data,int ix,int iy,int iw,int ih,int D,int LD)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  double dVar4;
  double dVar5;
  int iVar6;
  byte b;
  undefined8 *data_00;
  void *pvVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  char *pcVar12;
  int iVar13;
  byte *pbVar14;
  uchar *puVar15;
  undefined4 uVar16;
  double dVar17;
  byte *local_50;
  
  dVar4 = (double)iw;
  dVar5 = (double)ih;
  fwrite("save\n",5,1,(FILE *)this->output);
  uVar16 = SUB84((double)ix,0);
  if (this->lang_level_ < 2) {
    fprintf((FILE *)this->output,"%g %g %g %g %i %i GI",uVar16,(double)iy + dVar5,dVar4,-dVar5,
            (ulong)(uint)iw,ih);
  }
  else {
    pcVar12 = "true";
    if (this->interpolate_ == 0) {
      pcVar12 = "false";
    }
    dVar17 = (double)iy + dVar5;
    if ((this->lang_level_ == 2) || (this->mask == (uchar *)0x0)) {
      fprintf((FILE *)this->output,"%g %g %g %g %i %i %s GII\n",uVar16,dVar17,dVar4,-dVar5,
              (ulong)(uint)iw,ih);
    }
    else {
      fprintf((FILE *)this->output,"%g %g %g %g %i %i %i %i %s GIM\n",uVar16,dVar17,dVar4,-dVar5,
              (ulong)(uint)iw,ih,(ulong)(uint)this->mx,(ulong)(uint)this->my,pcVar12);
    }
  }
  bVar1 = this->bg_r;
  bVar2 = this->bg_g;
  bVar3 = this->bg_b;
  puVar15 = this->mask;
  data_00 = (undefined8 *)operator_new(0x90);
  data_00[0x11] = 0;
  pvVar7 = operator_new(0x14);
  *(undefined8 *)((long)pvVar7 + 4) = 0;
  *data_00 = pvVar7;
  if (0 < ih) {
    iVar6 = D * iw;
    if (LD != 0) {
      iVar6 = LD;
    }
    local_50 = data + 1;
    uVar8 = 0;
    do {
      if ((this->mask != (uchar *)0x0) && (iVar9 = this->my, 0 < iVar9 / ih)) {
        iVar11 = this->mx;
        iVar13 = 0;
        do {
          if (0 < iVar11) {
            lVar10 = 0;
            do {
              write_rle85(this,""[puVar15[lVar10] & 0xf] << 4 | ""[puVar15[lVar10] >> 4],data_00);
              iVar11 = this->mx;
              iVar9 = iVar11 + 0xe;
              if (-1 < iVar11 + 7) {
                iVar9 = iVar11 + 7;
              }
              lVar10 = lVar10 + 1;
            } while ((int)lVar10 < iVar9 >> 3);
            iVar9 = this->my;
            puVar15 = puVar15 + lVar10;
          }
          iVar13 = iVar13 + 1;
        } while (iVar13 < iVar9 / ih);
      }
      pbVar14 = local_50;
      iVar9 = iw;
      if (0 < iw) {
        do {
          b = pbVar14[-1];
          if ((1 < D) && (this->lang_level_ < 3)) {
            b = (byte)((ulong)((uint)b * (uint)*pbVar14 +
                              (*pbVar14 ^ 0xff) * (((uint)bVar2 + (uint)bVar1 + (uint)bVar3) / 3)) *
                       0x1010102 >> 0x20);
          }
          write_rle85(this,b,data_00);
          iVar9 = iVar9 + -1;
          pbVar14 = pbVar14 + D;
        } while (iVar9 != 0);
      }
      uVar8 = uVar8 + 1;
      local_50 = local_50 + iVar6;
    } while (uVar8 != (uint)ih);
  }
  close_rle85(this,data_00);
  fwrite("restore\n",8,1,(FILE *)this->output);
  return;
}

Assistant:

void Fl_PostScript_Graphics_Driver::draw_image_mono(const uchar *data, int ix, int iy, int iw, int ih, int D, int LD) {
  double x = ix, y = iy, w = iw, h = ih;

  fprintf(output,"save\n");

  int i,j, k;

  const char * interpol;
  if (lang_level_>1){
    if (interpolate_)
      interpol="true";
    else
      interpol="false";
    if (mask && lang_level_>2)
      fprintf(output, "%g %g %g %g %i %i %i %i %s GIM\n", x , y+h , w , -h , iw , ih, mx, my, interpol);
    else
      fprintf(output, "%g %g %g %g %i %i %s GII\n", x , y+h , w , -h , iw , ih, interpol);
  }else
    fprintf(output , "%g %g %g %g %i %i GI", x , y+h , w , -h , iw , ih);


  if (!LD) LD = iw*D;


  int bg = (bg_r + bg_g + bg_b)/3;

  uchar *curmask=mask;
  void *big = prepare_rle85();
  for (j=0; j<ih;j++){
    if (mask){
      for (k=0;k<my/ih;k++){
        for (i=0; i<((mx+7)/8);i++){
          write_rle85(swap_byte(*curmask), big);
          curmask++;
        }
      }
    }
    const uchar *curdata=data+j*LD;
    for (i=0 ; i<iw ; i++) {
      uchar r = curdata[0];
      if (lang_level_<3 && D>1) { //can do  mixing

        unsigned int a2 = curdata[1]; //must be int
        unsigned int a = 255-a2;
        r = (a2 * r + bg * a)/255;
      }
      write_rle85(r, big);
      curdata +=D;
    }

  }
  close_rle85(big);
  fprintf(output,"restore\n");
}